

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::ExactCompareDistance(Vector3_xf *x,Vector3_xf *y,ExactFloat *r2)

{
  int iVar1;
  int iVar2;
  ExactFloat cmp;
  ExactFloat cos_r;
  ExactFloat cos_xy;
  ExactFloat local_b0;
  ExactFloat local_a0;
  ExactFloat local_90;
  ExactFloat local_80;
  ExactFloat local_70;
  ExactFloat local_60;
  BasicVector<Vector3,_ExactFloat,_3UL> local_50 [8];
  BIGNUM *local_48;
  BasicVector<Vector3,_ExactFloat,_3UL> local_40 [8];
  BIGNUM *local_38;
  ExactFloat local_30;
  
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_70,x);
  ExactFloat::ExactFloat(&local_90,1);
  ExactFloat::ExactFloat(&local_b0,0.5);
  operator*(&local_a0,&local_b0);
  operator-(&local_80,&local_90);
  BN_free((BIGNUM *)local_a0.bn_.bn_);
  BN_free((BIGNUM *)local_b0.bn_.bn_);
  BN_free((BIGNUM *)local_90.bn_.bn_);
  iVar2 = 0;
  if ((local_70.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
    iVar2 = local_70.sign_;
  }
  iVar1 = 0;
  if ((local_80.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
    iVar1 = local_80.sign_;
  }
  if (iVar2 == iVar1) {
    operator*(&local_30,&local_80);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd(local_40,x);
    operator*(&local_b0,&local_30);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd(local_50,y);
    operator*(&local_a0,&local_b0);
    operator*(&local_60,&local_70);
    operator-(&local_90,&local_a0);
    BN_free((BIGNUM *)local_60.bn_.bn_);
    BN_free((BIGNUM *)local_a0.bn_.bn_);
    BN_free(local_48);
    BN_free((BIGNUM *)local_b0.bn_.bn_);
    BN_free(local_38);
    BN_free((BIGNUM *)local_30.bn_.bn_);
    BN_free((BIGNUM *)local_90.bn_.bn_);
    if ((local_90.bn_exp_ & 0xfffffffdU) == 0x7ffffffd) {
      local_90.sign_ = 0;
    }
    iVar2 = local_90.sign_ * iVar2;
  }
  else {
    iVar2 = (uint)(iVar2 <= iVar1) * 2 + -1;
  }
  BN_free((BIGNUM *)local_80.bn_.bn_);
  BN_free((BIGNUM *)local_70.bn_.bn_);
  return iVar2;
}

Assistant:

int ExactCompareDistance(const Vector3_xf& x, const Vector3_xf& y,
                         const ExactFloat& r2) {
  // This code produces the same result as though all points were reprojected
  // to lie exactly on the surface of the unit sphere.  It is based on
  // comparing the cosine of the angle XY (when both points are projected to
  // lie exactly on the sphere) to the given threshold.
  ExactFloat cos_xy = x.DotProd(y);
  ExactFloat cos_r = 1 - 0.5 * r2;
  // If the two values have different signs, we need to handle that case now
  // before squaring them below.
  int xy_sign = cos_xy.sgn(), r_sign = cos_r.sgn();
  if (xy_sign != r_sign) {
    return (xy_sign > r_sign) ? -1 : 1;  // If cos(XY) > cos(r), then XY < r.
  }
  ExactFloat cmp = cos_r * cos_r * x.Norm2() * y.Norm2() - cos_xy * cos_xy;
  return xy_sign * cmp.sgn();
}